

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_1000_1999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case1303(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t __len;
  allocator<char> local_54d;
  allocator<char> local_54c;
  allocator<char> local_54b;
  allocator<char> local_54a;
  allocator<char> local_549;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8 [32];
  Expectation local_4a8;
  Expectation local_3f0;
  Decl local_338;
  Decl local_270;
  Decl local_1a8;
  Decl local_e0;
  
  std::__cxx11::string::string<std::allocator<char>>(local_4c8,"x y [ 1 ] , z [ 2 ] ;",&local_549);
  Expectation::Expectation(&local_4a8);
  Decl::Decl(&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"y",&local_54a);
  pDVar1 = Decl::Object(&local_1a8,&local_4e8,VariableDeclaration,File);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"x",&local_54b);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_508,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Array,None,None);
  Decl::Decl(&local_e0,pDVar1);
  pEVar2 = Expectation::declaration(&local_4a8,&local_e0);
  Decl::Decl(&local_338);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"z",&local_54c);
  pDVar1 = Decl::Object(&local_338,&local_528,VariableDeclaration,File);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"x",&local_54d);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_548,None);
  __len = 0;
  pDVar1 = Ty::Derived(&pDVar1->ty_,Array,None,None);
  Decl::Decl(&local_270,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_270);
  Expectation::Expectation(&local_3f0,pEVar2);
  bind(this,(int)local_4c8,(sockaddr *)&local_3f0,__len);
  Expectation::~Expectation(&local_3f0);
  Decl::~Decl(&local_270);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_528);
  Decl::~Decl(&local_338);
  Decl::~Decl(&local_e0);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4e8);
  Decl::~Decl(&local_1a8);
  Expectation::~Expectation(&local_4a8);
  std::__cxx11::string::~string(local_4c8);
  return;
}

Assistant:

void DeclarationBinderTester::case1303()
{
    bind("x y [ 1 ] , z [ 2 ] ;",
         Expectation()
             .declaration(Decl().Object("y", SymbolKind::VariableDeclaration)
                      .ty_.Typedef("x", CVR::None)
                      .ty_.Derived(TypeKind::Array, CVR::None))
             .declaration(Decl().Object("z", SymbolKind::VariableDeclaration)
                      .ty_.Typedef("x", CVR::None)
                      .ty_.Derived(TypeKind::Array, CVR::None)));
}